

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::DistantLightSource::writeTo(DistantLightSource *this,BinaryWriter *binary)

{
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->from);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->to);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->L);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->scale);
  BinaryWriter::write<pbrt::math::affine3f>(binary,&this->transform);
  return 0x47;
}

Assistant:

int DistantLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(from);
    binary.write(to);
    binary.write(L);
    binary.write(scale);
    binary.write(transform);
    return TYPE_DISTANT_LIGHT_SOURCE;
  }